

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O3

Curl_tree * Curl_splay(curltime i,Curl_tree *t)

{
  int iVar1;
  long lVar2;
  Curl_tree *pCVar3;
  Curl_tree *pCVar4;
  Curl_tree *pCVar5;
  int iVar6;
  long lVar7;
  Curl_tree *pCVar8;
  Curl_tree N;
  
  lVar7 = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    return (Curl_tree *)0x0;
  }
  pCVar8 = &N;
  N.smaller = (Curl_tree *)0x0;
  N.larger = (Curl_tree *)0x0;
  pCVar5 = pCVar8;
  do {
    lVar2 = (t->key).tv_sec;
    iVar6 = i.tv_usec;
    if (lVar7 < lVar2) {
LAB_0012f421:
      pCVar3 = t->smaller;
      if (pCVar3 == (Curl_tree *)0x0) goto LAB_0012f49c;
      lVar2 = (pCVar3->key).tv_sec;
      if ((lVar7 < lVar2) || ((lVar7 <= lVar2 && (iVar6 < (pCVar3->key).tv_usec)))) {
        t->smaller = pCVar3->larger;
        pCVar3->larger = t;
        t = pCVar3;
        if (pCVar3->smaller == (Curl_tree *)0x0) goto LAB_0012f49c;
      }
      pCVar8->smaller = t;
      pCVar4 = pCVar5;
      pCVar8 = t;
    }
    else {
      if (lVar7 <= lVar2) {
        iVar1 = (t->key).tv_usec;
        if (iVar6 < iVar1) goto LAB_0012f421;
        if (iVar6 <= iVar1) {
LAB_0012f49c:
          pCVar5->larger = t->smaller;
          pCVar8->smaller = t->larger;
          t->smaller = N.larger;
          t->larger = N.smaller;
          return t;
        }
      }
      pCVar3 = t->larger;
      if (pCVar3 == (Curl_tree *)0x0) goto LAB_0012f49c;
      lVar2 = (pCVar3->key).tv_sec;
      pCVar4 = t;
      if ((lVar2 <= lVar7) && ((lVar2 < lVar7 || ((pCVar3->key).tv_usec < iVar6)))) {
        t->larger = pCVar3->smaller;
        pCVar3->smaller = t;
        pCVar4 = pCVar3;
        t = pCVar3;
        if (pCVar3->larger == (Curl_tree *)0x0) goto LAB_0012f49c;
      }
      pCVar5->larger = pCVar4;
      t = (Curl_tree *)&pCVar4->larger;
    }
    t = t->smaller;
    pCVar5 = pCVar4;
  } while( true );
}

Assistant:

struct Curl_tree *Curl_splay(struct curltime i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;
  long comp;

  if(t == NULL)
    return t;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    comp = compare(i, t->key);
    if(comp < 0) {
      if(t->smaller == NULL)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(t->smaller == NULL)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(t->larger == NULL)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(t->larger == NULL)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}